

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osal.c
# Opt level: O0

void osal_timer_start(osal_timert *self,uint32 timeout_usec)

{
  uint32 local_48;
  timeval stop_time;
  timeval timeout;
  timeval start_time;
  uint32 timeout_usec_local;
  osal_timert *self_local;
  
  osal_gettimeofday((timeval *)&timeout.tv_usec,(timezone *)0x0);
  local_48 = (int)timeout.tv_usec + timeout_usec / 1000000;
  stop_time.tv_sec = start_time.tv_sec + (ulong)timeout_usec % 1000000;
  if (999999 < stop_time.tv_sec) {
    local_48 = local_48 + 1;
    stop_time.tv_sec = stop_time.tv_sec + -1000000;
  }
  (self->stop_time).sec = local_48;
  (self->stop_time).usec = (uint32)stop_time.tv_sec;
  return;
}

Assistant:

void osal_timer_start (osal_timert * self, uint32 timeout_usec)
{
   struct timeval start_time;
   struct timeval timeout;
   struct timeval stop_time;

   osal_gettimeofday (&start_time, 0);
   timeout.tv_sec = timeout_usec / USECS_PER_SEC;
   timeout.tv_usec = timeout_usec % USECS_PER_SEC;
   timeradd (&start_time, &timeout, &stop_time);

   self->stop_time.sec = stop_time.tv_sec;
   self->stop_time.usec = stop_time.tv_usec;
}